

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O3

int EVP_PKEY_set_type(EVP_PKEY *pkey,int type)

{
  code *pcVar1;
  EVP_PKEY_ASN1_METHOD *pEVar2;
  
  if ((((pkey != (EVP_PKEY *)0x0) && (*(long *)&pkey->references != 0)) &&
      (pkey->ameth != (EVP_PKEY_ASN1_METHOD *)0x0)) &&
     (pcVar1 = *(code **)(pkey->ameth + 0xa0), pcVar1 != (code *)0x0)) {
    (*pcVar1)(pkey);
    *(undefined8 *)&pkey->references = 0;
    pkey->save_type = 0;
  }
  if (type < 0x198) {
    if (type == 6) {
      pEVar2 = &rsa_asn1_meth;
    }
    else {
      if (type != 0x74) {
LAB_00188452:
        ERR_put_error(6,0,0x80,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp.cc"
                      ,0xde);
        ERR_add_error_dataf("algorithm %d",type);
        return 0;
      }
      pEVar2 = &dsa_asn1_meth;
    }
  }
  else if (type == 0x3b5) {
    pEVar2 = &ed25519_asn1_meth;
  }
  else if (type == 0x3b4) {
    pEVar2 = &x25519_asn1_meth;
  }
  else {
    if (type != 0x198) goto LAB_00188452;
    pEVar2 = &ec_asn1_meth;
  }
  if (pkey != (EVP_PKEY *)0x0) {
    if ((pkey->ameth != (EVP_PKEY_ASN1_METHOD *)0x0) &&
       (pcVar1 = *(code **)(pkey->ameth + 0xa0), pcVar1 != (code *)0x0)) {
      (*pcVar1)(pkey);
      *(undefined8 *)&pkey->references = 0;
    }
    pkey->ameth = (EVP_PKEY_ASN1_METHOD *)pEVar2;
    pkey->save_type = pEVar2->pkey_id;
  }
  return 1;
}

Assistant:

int EVP_PKEY_set_type(EVP_PKEY *pkey, int type) {
  if (pkey && pkey->pkey) {
    // This isn't strictly necessary, but historically |EVP_PKEY_set_type| would
    // clear |pkey| even if |evp_pkey_asn1_find| failed, so we preserve that
    // behavior.
    free_it(pkey);
  }

  const EVP_PKEY_ASN1_METHOD *ameth = evp_pkey_asn1_find(type);
  if (ameth == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    ERR_add_error_dataf("algorithm %d", type);
    return 0;
  }

  if (pkey) {
    evp_pkey_set_method(pkey, ameth);
  }

  return 1;
}